

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_handle_directive(Parser *this,csubstr directive_)

{
  size_t node;
  Tree *pTVar1;
  code *pcVar2;
  bool bVar3;
  long lVar4;
  size_t sVar5;
  NodeType NVar6;
  csubstr fmt;
  csubstr fmt_00;
  basic_substring<const_char> local_98;
  basic_substring<const_char> local_80;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  basic_substring<const_char> local_58;
  TagDirective local_48;
  
  local_58.len = directive_.len;
  local_58.str = directive_.str;
  if (3 < local_58.len) {
    lVar4 = 0;
    do {
      if (local_58.str[lVar4] != "%TAG"[lVar4]) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    local_48.prefix.str = (char *)0x0;
    local_48.prefix.len = 0;
    local_48.handle.str = (char *)0x0;
    local_48.handle.len = 0;
    local_98.str = local_58.str;
    local_98.len = local_58.len;
    basic_substring<const_char>::basic_substring(&local_80,local_58.str + 4,local_58.len - 4);
    if ((local_80.len == 0) || (*local_80.str != ' ')) {
      bVar3 = is_debugger_attached();
      if ((bVar3) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      fmt.len = 0x22;
      fmt.str = "ERROR: malformed tag directive: {}";
      _err<c4::basic_substring<char_const>>(this,fmt,&local_58);
    }
    local_98 = basic_substring<const_char>::triml(&local_98,' ');
    sVar5 = basic_substring<const_char>::first_of(&local_98,' ',0);
    if (sVar5 == 0xffffffffffffffff) {
      bVar3 = is_debugger_attached();
      if ((bVar3) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      fmt_00.len = 0x22;
      fmt_00.str = "ERROR: malformed tag directive: {}";
      _err<c4::basic_substring<char_const>>(this,fmt_00,&local_58);
      basic_substring<const_char>::basic_substring(&local_80,local_98.str,local_98.len);
    }
    else {
      if (local_98.len < sVar5) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      basic_substring<const_char>::basic_substring(&local_80,local_98.str,sVar5);
    }
    local_48.handle.str = local_80.str;
    local_48.handle.len = local_80.len;
    if (local_98.len < local_80.len) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      handle_error(0x2467aa,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_80,local_98.str + local_80.len,local_98.len - local_80.len);
    local_98 = basic_substring<const_char>::triml(&local_80,' ');
    sVar5 = basic_substring<const_char>::first_of(&local_98,' ',0);
    if (sVar5 != 0xffffffffffffffff) {
      if (local_98.len < sVar5) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      basic_substring<const_char>::basic_substring(&local_80,local_98.str,sVar5);
      local_98.len = local_80.len;
      local_98.str = local_80.str;
    }
    local_48.prefix.str = local_98.str;
    local_48.prefix.len = local_98.len;
    sVar5 = this->m_tree->m_size;
    local_48.next_node_id = sVar5;
    if (sVar5 != 0) {
      node = sVar5 - 1;
      bVar3 = Tree::is_root(this->m_tree,node);
      if ((bVar3) && (NVar6 = Tree::type(this->m_tree,node), NVar6.type != NOTYPE)) {
        pTVar1 = this->m_tree;
        if (pTVar1->m_cap <= node) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_80.str = (char *)0x0;
          local_80.len = 0x4b86;
          local_70 = 0;
          pcStack_68 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_60 = 0x65;
          (*(code *)PTR_error_impl_00297798)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((~(int)pTVar1->m_buf[node].m_type.type & 0x28U) != 0) {
          local_48.next_node_id = sVar5 + 1;
        }
      }
    }
    Tree::add_tag_directive(this->m_tree,&local_48);
  }
  return;
}

Assistant:

void Parser::_handle_directive(csubstr directive_)
{
    csubstr directive = directive_;
    if(directive.begins_with("%TAG"))
    {
        TagDirective td;
        _c4dbgpf("%TAG directive: {}", directive_);
        directive = directive.sub(4);
        if(!directive.begins_with(' '))
            _c4err("malformed tag directive: {}", directive_);
        directive = directive.triml(' ');
        size_t pos = directive.find(' ');
        if(pos == npos)
            _c4err("malformed tag directive: {}", directive_);
        td.handle = directive.first(pos);
        directive = directive.sub(td.handle.len).triml(' ');
        pos = directive.find(' ');
        if(pos != npos)
            directive = directive.first(pos);
        td.prefix = directive;
        td.next_node_id = m_tree->size();
        if(m_tree->size() > 0)
        {
            size_t prev = m_tree->size() - 1;
            if(m_tree->is_root(prev) && m_tree->type(prev) != NOTYPE && !m_tree->is_stream(prev))
                ++td.next_node_id;
        }
        _c4dbgpf("%TAG: handle={} prefix={} next_node={}", td.handle, td.prefix, td.next_node_id);
        m_tree->add_tag_directive(td);
    }
    else if(directive.begins_with("%YAML"))
    {
        _c4dbgpf("%YAML directive! ignoring...: {}", directive);
    }
}